

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

cali_id_t cali_make_loop_iteration_attribute(char *name)

{
  string *name_00;
  cali_id_t cVar1;
  allocator<char> local_69;
  string local_68 [32];
  Attribute local_48;
  Attribute attr;
  Caliper c;
  Variant v_true;
  char *name_local;
  
  cali::Variant::Variant((Variant *)&c.m_is_signal,true);
  cali::Caliper::Caliper((Caliper *)&attr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"iteration#",&local_69);
  name_00 = (string *)std::__cxx11::string::append((char *)local_68);
  local_48 = cali::Caliper::create_attribute
                       ((Caliper *)&attr,name_00,CALI_TYPE_INT,1,1,
                        (Attribute *)&cali::class_iteration_attr,(Variant *)&c.m_is_signal);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  cVar1 = cali::Attribute::id(&local_48);
  cali::Caliper::~Caliper((Caliper *)&attr);
  return cVar1;
}

Assistant:

cali_id_t cali_make_loop_iteration_attribute(const char* name)
{
    Variant v_true(true);

    Caliper   c;
    Attribute attr = c.create_attribute(
        std::string("iteration#").append(name),
        CALI_TYPE_INT,
        CALI_ATTR_ASVALUE,
        1,
        &class_iteration_attr,
        &v_true
    );

    return attr.id();
}